

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

bool __thiscall tinyusdz::Layer::check_unresolved_payload(Layer *this,uint32_t max_depth)

{
  bool bVar1;
  Layer LVar2;
  Layer *pLVar3;
  
  pLVar3 = this + 0x30;
  LVar2 = (Layer)0x0;
  do {
    pLVar3 = *(Layer **)pLVar3;
    if (pLVar3 == (Layer *)0x0) goto LAB_0013a80a;
    bVar1 = anon_unknown_240::HasPayloadRec(0,(PrimSpec *)(pLVar3 + 0x28),max_depth);
  } while (!bVar1);
  LVar2 = (Layer)0x1;
LAB_0013a80a:
  this[0x15b2] = LVar2;
  return (bool)LVar2;
}

Assistant:

bool Layer::check_unresolved_payload(const uint32_t max_depth) const {
  bool ret = false;

  for (const auto &item : _prim_specs) {
    if (HasPayloadRec(/* depth */ 0, item.second, max_depth)) {
      ret = true;
      break;
    }
  }

  _has_unresolved_payload = ret;
  return _has_unresolved_payload;
}